

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O2

void __thiscall trackerboy::apu::WaveChannel::setVolume(WaveChannel *this,uint8_t volume)

{
  byte bVar1;
  
  bVar1 = 2;
  if (volume < 3) {
    bVar1 = (byte)(0x10004 >> (volume * '\b' & 0x1f));
  }
  this->mWaveVolume = volume;
  this->mVolumeShift = bVar1;
  (this->super_Channel).mOutput = this->mSampleBuffer >> (bVar1 & 0x1f);
  return;
}

Assistant:

void WaveChannel::setVolume(uint8_t volume) noexcept {
    mWaveVolume = volume;
    switch (volume) {
        case VolumeMute:
            mVolumeShift = 4;
            break;
        case VolumeFull:
            mVolumeShift = 0;
            break;
        case VolumeHalf:
            mVolumeShift = 1;
            break;
        default:
            mVolumeShift = 2;
            break;
    }
    updateOutput();
}